

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tourmng.cpp
# Opt level: O2

string * banksia::TourMng::createLogPath
                   (string *__return_storage_ptr__,string *opath,bool onefile,bool usesurfix,
                   bool includeGameResult,Game *game,Side forSide)

{
  int iVar1;
  Player *pPVar2;
  long lVar3;
  undefined1 shortFrom;
  char *__lhs;
  string local_d0;
  string local_b0;
  string s;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_70;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_50;
  
  if (game == (Game *)0x0 || onefile) {
    std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)opath);
    return __return_storage_ptr__;
  }
  __lhs = "-";
  if (usesurfix) {
    __lhs = ", ";
  }
  shortFrom = usesurfix;
  iVar1 = Game::getIdx(game);
  std::__cxx11::to_string(&local_d0,iVar1 + 1);
  std::operator+(&s,__lhs,&local_d0);
  std::__cxx11::string::~string((string *)&local_d0);
  if (usesurfix) {
    pPVar2 = Game::getPlayer(game,white);
    if ((pPVar2 == (Player *)0x0) || (pPVar2 = Game::getPlayer(game,black), pPVar2 == (Player *)0x0)
       ) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,"",(allocator *)&local_d0);
      goto LAB_0014d8bb;
    }
    Game::getGameTitleString_abi_cxx11_(&local_b0,game,includeGameResult);
    std::operator+(&local_d0,") ",&local_b0);
    std::__cxx11::string::append((string *)&s);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  if (forSide != none) {
    side2String_abi_cxx11_(&local_b0,(banksia *)(ulong)forSide,white,(bool)shortFrom);
    std::operator+(&local_d0,", ",&local_b0);
    std::__cxx11::string::append((string *)&s);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_b0);
  }
  lVar3 = std::__cxx11::string::rfind((char *)opath,0x16d008);
  if (lVar3 == -1) {
    std::__cxx11::string::append((string *)opath);
  }
  else {
    std::__cxx11::string::substr((ulong)&local_50,(ulong)opath);
    std::operator+(&local_b0,&local_50,&s);
    std::__cxx11::string::substr((ulong)&local_70,(ulong)opath);
    std::operator+(&local_d0,&local_b0,&local_70);
    std::__cxx11::string::operator=((string *)opath,(string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_d0);
    std::__cxx11::string::~string((string *)&local_70);
    std::__cxx11::string::~string((string *)&local_b0);
    std::__cxx11::string::~string((string *)&local_50);
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)opath);
LAB_0014d8bb:
  std::__cxx11::string::~string((string *)&s);
  return __return_storage_ptr__;
}

Assistant:

std::string TourMng::createLogPath(std::string opath, bool onefile, bool usesurfix, bool includeGameResult, const Game* game, Side forSide)
{
    if (onefile || game == nullptr) return opath;
    
    std::string s = (usesurfix ? ", " : "-") + std::to_string(game->getIdx() + 1);
    if (usesurfix) {
        if (!game->getPlayer(Side::white) || !game->getPlayer(Side::black)) {
            return "";
        }
        s += ") " + game->getGameTitleString(includeGameResult);
    }
    
    if (forSide != Side::none) {
        s += ", " + side2String(forSide, true);
    }
    
    auto p = opath.rfind(".");
    if (p == std::string::npos) {
        opath += s;
    } else {
        opath = opath.substr(0, p) + s + opath.substr(p);
    }
    return opath;
}